

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_think.cpp
# Opt level: O2

void __thiscall DBot::ThinkForMove(DBot *this,ticcmd_t *cmd)

{
  TObjPtr<AActor> *obj;
  TObjPtr<AActor> *pTVar1;
  TObjPtr<AActor> *obj_00;
  ActorFlags *pAVar2;
  double *pdVar3;
  byte *pbVar4;
  APlayerPawn *pAVar5;
  AWeapon *pAVar6;
  double dVar7;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 aVar8;
  bool bVar9;
  short sVar10;
  uint uVar11;
  int iVar12;
  AActor *pAVar13;
  PClass *pPVar14;
  AActor *pAVar15;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 aVar16;
  player_t *ppVar17;
  short sVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  double dVar21;
  double dVar22;
  TThinkerIterator<AInventory> it;
  DAngle local_48;
  DAngle local_40;
  DAngle local_38;
  
  obj = &this->dest;
  pAVar13 = GC::ReadBarrier<AActor>((AActor **)obj);
  if (pAVar13 == (AActor *)0x0) {
    uVar19 = 0;
    uVar20 = 0;
  }
  else {
    pAVar5 = this->player->mo;
    pAVar13 = GC::ReadBarrier<AActor>((AActor **)obj);
    dVar7 = AActor::Distance2D(&pAVar5->super_AActor,pAVar13,false);
    uVar19 = SUB84(dVar7,0);
    uVar20 = (undefined4)((ulong)dVar7 >> 0x20);
  }
  pTVar1 = &this->missile;
  pAVar13 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
  if (pAVar13 != (AActor *)0x0) {
    pAVar13 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
    dVar7 = (pAVar13->Vel).X;
    if ((dVar7 != 0.0) || (NAN(dVar7))) {
      pAVar13 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
      dVar7 = (pAVar13->Vel).Y;
      if ((dVar7 != 0.0) || (NAN(dVar7))) {
        pAVar13 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
        local_38.Degrees = 90.0;
        bVar9 = Check_LOS(this,pAVar13,&local_38);
        if (bVar9) goto LAB_00420bab;
      }
    }
    this->sleft = (bool)(this->sleft ^ 1);
    (this->missile).field_0.p = (AActor *)0x0;
  }
LAB_00420bab:
  pAVar13 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
  if (pAVar13 != (AActor *)0x0) {
    pAVar5 = this->player->mo;
    pAVar13 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
    dVar7 = AActor::Distance2D(&pAVar5->super_AActor,pAVar13,false);
    if (686.6455078125 <= dVar7) goto LAB_00420cf2;
    pAVar13 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
    Pitch(this,pAVar13);
    pAVar5 = this->player->mo;
    pAVar13 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
    AActor::AngleTo((AActor *)&it,&pAVar5->super_AActor,SUB81(pAVar13,0));
    (this->Angle).Degrees = (double)it.super_FThinkerIterator.m_ParentType;
    bVar9 = this->sleft;
    sVar10 = 0x2800;
    if (bVar9 != false) {
      sVar10 = -0x2800;
    }
    (cmd->ucmd).sidemove = sVar10;
    (cmd->ucmd).forwardmove = -0x3200;
    pAVar5 = this->player->mo;
    dVar7 = (pAVar5->super_AActor).__Pos.Z;
    dVar21 = (pAVar5->super_AActor).__Pos.X - (this->old).X;
    dVar22 = (pAVar5->super_AActor).__Pos.Y - (this->old).Y;
    if ((dVar7 * dVar7 + dVar22 * dVar22 + dVar21 * dVar21 < 0.5820766091346741) &&
       (this->t_strafe < 1)) {
      this->t_strafe = 5;
      this->sleft = (bool)(bVar9 ^ 1);
    }
    pAVar13 = GC::ReadBarrier<AActor>((AActor **)&this->enemy);
    if (pAVar13 == (AActor *)0x0) goto LAB_00421487;
    pAVar13 = GC::ReadBarrier<AActor>((AActor **)&this->enemy);
    local_40.Degrees = 60.0;
    bVar9 = Check_LOS(this,pAVar13,&local_40);
    if (!bVar9) goto LAB_00421487;
LAB_00421308:
    Dofire(this,cmd);
    goto LAB_00421487;
  }
LAB_00420cf2:
  pTVar1 = &this->enemy;
  pAVar13 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
  if (pAVar13 == (AActor *)0x0) {
LAB_00420f3b:
    obj_00 = &this->mate;
    pAVar13 = GC::ReadBarrier<AActor>((AActor **)obj_00);
    if ((pAVar13 == (AActor *)0x0) ||
       (pAVar13 = GC::ReadBarrier<AActor>((AActor **)pTVar1), pAVar13 != (AActor *)0x0)) {
LAB_00420f5d:
      this->first_shot = true;
    }
    else {
      pAVar13 = GC::ReadBarrier<AActor>((AActor **)obj);
      if (pAVar13 != (AActor *)0x0) {
        pAVar13 = GC::ReadBarrier<AActor>((AActor **)obj_00);
        pAVar15 = GC::ReadBarrier<AActor>((AActor **)obj);
        if (pAVar15 != pAVar13) goto LAB_00420f5d;
      }
      pAVar13 = GC::ReadBarrier<AActor>((AActor **)obj_00);
      Pitch(this,pAVar13);
      pAVar13 = GC::ReadBarrier<AActor>((AActor **)obj_00);
      bVar9 = Reachable(this,pAVar13);
      if (bVar9) {
        pAVar5 = this->player->mo;
        pAVar13 = GC::ReadBarrier<AActor>((AActor **)obj_00);
        AActor::AngleTo((AActor *)&it,&pAVar5->super_AActor,SUB81(pAVar13,0));
        (this->Angle).Degrees = (double)it.super_FThinkerIterator.m_ParentType;
        pAVar5 = this->player->mo;
        pAVar13 = GC::ReadBarrier<AActor>((AActor **)obj_00);
        dVar7 = AActor::Distance2D(&pAVar5->super_AActor,pAVar13,false);
        if (dVar7 <= 457.763671875) {
          if (dVar7 <= 228.8818359375) {
            if (dVar7 < 152.587890625) {
              (cmd->ucmd).forwardmove = -0x1900;
            }
          }
          else {
            (cmd->ucmd).forwardmove = 0x1900;
          }
        }
        else {
          (cmd->ucmd).forwardmove = 0x3200;
        }
        goto LAB_00421487;
      }
      pAVar13 = GC::ReadBarrier<AActor>((AActor **)obj);
      pAVar15 = GC::ReadBarrier<AActor>((AActor **)obj_00);
      if ((pAVar15 == pAVar13) && (iVar12 = FRandom::operator()(&pr_botmove), iVar12 < 0x20)) {
        (obj->field_0).p = (AActor *)0x0;
      }
    }
  }
  else {
    pAVar5 = this->player->mo;
    pAVar13 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
    bVar9 = P_CheckSight(&pAVar5->super_AActor,pAVar13,0);
    if (!bVar9) goto LAB_00420f3b;
    pAVar13 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
    Pitch(this,pAVar13);
    pAVar13 = GC::ReadBarrier<AActor>((AActor **)obj);
    if ((pAVar13 == (AActor *)0x0) ||
       (pAVar13 = GC::ReadBarrier<AActor>((AActor **)obj), ((pAVar13->flags).Value & 1) == 0)) {
LAB_00420edb:
      (this->dest).field_0.p = (AActor *)0x0;
      pAVar6 = this->player->ReadyWeapon;
      if ((pAVar6 != (AWeapon *)0x0) && (((pAVar6->super_AInventory).field_0x4dd & 2) == 0)) {
        pAVar2 = &(this->player->mo->super_AActor).flags;
        pAVar2->Value = pAVar2->Value & 0xfffffbff;
      }
      pAVar13 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
      if (((pAVar13->flags3).Value & 0x2000) == 0) {
        this->t_fight = 0x46;
      }
      if ((0 < this->t_strafe) ||
         ((pAVar5 = this->player->mo, dVar7 = (pAVar5->super_AActor).__Pos.Z,
          dVar21 = (pAVar5->super_AActor).__Pos.X - (this->old).X,
          dVar22 = (pAVar5->super_AActor).__Pos.Y - (this->old).Y,
          0.5820766091346741 <= dVar7 * dVar7 + dVar22 * dVar22 + dVar21 * dVar21 &&
          (iVar12 = FRandom::operator()(&pr_botmove), iVar12 % 0x1e != 10)))) {
        bVar9 = false;
      }
      else {
        this->t_strafe = 5;
        this->sleft = (bool)(this->sleft ^ 1);
        bVar9 = true;
      }
      pAVar5 = this->player->mo;
      pAVar13 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
      AActor::AngleTo((AActor *)&it,&pAVar5->super_AActor,SUB81(pAVar13,0));
      (this->Angle).Degrees = (double)it.super_FThinkerIterator.m_ParentType;
      if (this->player->ReadyWeapon == (AWeapon *)0x0) {
LAB_004212a9:
        pAVar13 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
        sVar10 = 0x1900;
        if (((pAVar13->flags3).Value & 0x2000) == 0) {
          sVar10 = 0x3200;
        }
LAB_004212ca:
        (cmd->ucmd).forwardmove = sVar10;
      }
      else {
        pAVar5 = this->player->mo;
        pAVar13 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
        dVar7 = AActor::Distance2D(&pAVar5->super_AActor,pAVar13,false);
        pdVar3 = &this->player->ReadyWeapon->MoveCombatDist;
        if (*pdVar3 <= dVar7 && dVar7 != *pdVar3) goto LAB_004212a9;
        if (!bVar9) {
          pAVar13 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
          sVar10 = -0x1900;
          if (((pAVar13->flags3).Value & 0x2000) == 0) {
            sVar10 = -0x3200;
          }
          goto LAB_004212ca;
        }
      }
      pAVar13 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
      bVar9 = (this->sleft & 1U) != 0;
      sVar10 = 0x2800;
      if (bVar9) {
        sVar10 = -0x2800;
      }
      sVar18 = 0x1800;
      if (bVar9) {
        sVar18 = -0x1800;
      }
      if (((pAVar13->flags3).Value >> 0xd & 1) == 0) {
        sVar18 = sVar10;
      }
      (cmd->ucmd).sidemove = sVar18;
      goto LAB_00421308;
    }
    if ((this->player->mo->super_AActor).health < (this->skill).isp) {
      pAVar13 = GC::ReadBarrier<AActor>((AActor **)obj);
      pPVar14 = PClass::FindClass("Medikit");
      bVar9 = DObject::IsKindOf((DObject *)pAVar13,pPVar14);
      if (!bVar9) {
        pAVar13 = GC::ReadBarrier<AActor>((AActor **)obj);
        pPVar14 = PClass::FindClass("Stimpack");
        bVar9 = DObject::IsKindOf((DObject *)pAVar13,pPVar14);
        if (!bVar9) {
          pAVar13 = GC::ReadBarrier<AActor>((AActor **)obj);
          pPVar14 = PClass::FindClass("Soulsphere");
          bVar9 = DObject::IsKindOf((DObject *)pAVar13,pPVar14);
          if (!bVar9) {
            pAVar13 = GC::ReadBarrier<AActor>((AActor **)obj);
            pPVar14 = PClass::FindClass("Megasphere");
            bVar9 = DObject::IsKindOf((DObject *)pAVar13,pPVar14);
            if (!bVar9) {
              pAVar13 = GC::ReadBarrier<AActor>((AActor **)obj);
              pPVar14 = PClass::FindClass("CrystalVial");
              bVar9 = DObject::IsKindOf((DObject *)pAVar13,pPVar14);
              if (!bVar9) goto LAB_00420e47;
            }
          }
        }
      }
    }
    else {
LAB_00420e47:
      pAVar13 = GC::ReadBarrier<AActor>((AActor **)obj);
      pPVar14 = PClass::FindClass("Invulnerability");
      bVar9 = DObject::IsKindOf((DObject *)pAVar13,pPVar14);
      if (!bVar9) {
        pAVar13 = GC::ReadBarrier<AActor>((AActor **)obj);
        pPVar14 = PClass::FindClass("Invisibility");
        bVar9 = DObject::IsKindOf((DObject *)pAVar13,pPVar14);
        if (!bVar9) {
          pAVar13 = GC::ReadBarrier<AActor>((AActor **)obj);
          pPVar14 = PClass::FindClass("Megasphere");
          bVar9 = DObject::IsKindOf((DObject *)pAVar13,pPVar14);
          if ((((133.514404296875 <= (double)CONCAT44(uVar20,uVar19)) && (!bVar9)) &&
              (pAVar6 = this->player->ReadyWeapon, pAVar6 != (AWeapon *)0x0)) &&
             (((pAVar6->super_AInventory).field_0x4dd & 2) == 0)) goto LAB_00420edb;
        }
      }
    }
    if (((534.0576171875 <= (double)CONCAT44(uVar20,uVar19)) &&
        (pAVar6 = this->player->ReadyWeapon, pAVar6 != (AWeapon *)0x0)) &&
       (((pAVar6->super_AInventory).field_0x4dd & 2) == 0)) goto LAB_00420edb;
    pAVar13 = GC::ReadBarrier<AActor>((AActor **)obj);
    bVar9 = Reachable(this,pAVar13);
    if (!bVar9) goto LAB_00420edb;
  }
  pAVar13 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
  if (pAVar13 != (AActor *)0x0) {
    pAVar13 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
    local_48.Degrees = 90.0;
    bVar9 = Check_LOS(this,pAVar13,&local_48);
    if (bVar9) {
      Dofire(this,cmd);
    }
  }
  pAVar13 = GC::ReadBarrier<AActor>((AActor **)obj);
  if (((pAVar13 != (AActor *)0x0) &&
      (pAVar13 = GC::ReadBarrier<AActor>((AActor **)obj), ((pAVar13->flags).Value & 1) == 0)) &&
     (pAVar13 = GC::ReadBarrier<AActor>((AActor **)obj), pAVar13->health < 0)) {
    (obj->field_0).p = (AActor *)0x0;
  }
  pAVar13 = GC::ReadBarrier<AActor>((AActor **)obj);
  if (pAVar13 == (AActor *)0x0) {
    if ((this->t_fight == 0) ||
       (pAVar13 = GC::ReadBarrier<AActor>((AActor **)pTVar1), pAVar13 == (AActor *)0x0)) {
      uVar11 = FRandom::operator()(&pr_botmove);
      if ((int)uVar11 < 0x80) {
        pAVar13 = GC::ReadBarrier<AActor>((AActor **)&bglobal.firstthing);
        TThinkerIterator<AInventory>::TThinkerIterator
                  ((TThinkerIterator<AInventory> *)&it.super_FThinkerIterator,0x80,
                   &pAVar13->super_DThinker);
        aVar16.p = (AActor *)FThinkerIterator::Next(&it.super_FThinkerIterator);
        if ((aVar16.p == (AActor *)0x0) &&
           (aVar16.p = (AActor *)FThinkerIterator::Next(&it.super_FThinkerIterator),
           aVar16.p == (AActor *)0x0)) goto LAB_00421458;
        uVar11 = uVar11 & 0x3f;
        while (bVar9 = uVar11 != 0, uVar11 = uVar11 - 1, bVar9) {
          aVar16.p = (AActor *)FThinkerIterator::Next(&it.super_FThinkerIterator);
        }
        aVar8 = aVar16;
        if (aVar16.p == (AActor *)0x0) {
          aVar16.p = (AActor *)FThinkerIterator::Next(&it.super_FThinkerIterator);
          aVar8.p = aVar16.p;
        }
      }
      else {
        pTVar1 = &this->mate;
        pAVar13 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
        if (pAVar13 == (AActor *)0x0) {
LAB_004213e3:
          if ((playeringame[uVar11 & 7] != true) ||
             (aVar16 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)
                       ((anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)
                       (&players + (ulong)(uVar11 & 7) * 0x54))->p,
             aVar8 = bglobal.firstthing.field_0, (aVar16.p)->health < 1)) goto LAB_00421458;
        }
        else {
          if (0xb2 < uVar11) {
            pAVar5 = this->player->mo;
            pAVar13 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
            bVar9 = P_CheckSight(&pAVar5->super_AActor,pAVar13,0);
            if (!bVar9) goto LAB_004213e3;
          }
          aVar16.p = *(AActor **)&pTVar1->field_0;
          aVar8 = bglobal.firstthing.field_0;
        }
      }
LAB_00421397:
      bglobal.firstthing.field_0 = aVar8;
      (obj->field_0).p = (AActor *)aVar16;
    }
    else {
      pAVar13 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
      if (pAVar13->player == (player_t *)0x0) {
LAB_00421086:
        aVar16.p = *(AActor **)&pTVar1->field_0;
        aVar8 = bglobal.firstthing.field_0;
        goto LAB_00421397;
      }
      pAVar13 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
      if (((pAVar13->player->ReadyWeapon == (AWeapon *)0x0) ||
          (pAVar13 = GC::ReadBarrier<AActor>((AActor **)pTVar1),
          ((pAVar13->player->ReadyWeapon->super_AInventory).field_0x4df & 0x40) == 0)) &&
         (iVar12 = FRandom::operator()(&pr_botmove), iVar12 % 100 <= (this->skill).isp)) {
        ppVar17 = this->player;
      }
      else {
        ppVar17 = this->player;
        if ((ppVar17->ReadyWeapon != (AWeapon *)0x0) &&
           (((ppVar17->ReadyWeapon->super_AInventory).field_0x4dd & 2) == 0)) goto LAB_00421086;
      }
      pAVar5 = ppVar17->mo;
      pAVar13 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
      AActor::AngleTo((AActor *)&it,&pAVar5->super_AActor,SUB81(pAVar13,0));
      (this->Angle).Degrees = (double)it.super_FThinkerIterator.m_ParentType;
    }
LAB_00421458:
    pAVar13 = GC::ReadBarrier<AActor>((AActor **)obj);
    if (pAVar13 != (AActor *)0x0) {
      this->t_roam = 0x8c;
    }
  }
  pAVar13 = GC::ReadBarrier<AActor>((AActor **)obj);
  if (pAVar13 != (AActor *)0x0) {
    Roam(this,cmd);
  }
LAB_00421487:
  if ((this->t_roam == 0) &&
     (pAVar13 = GC::ReadBarrier<AActor>((AActor **)obj), pAVar13 != (AActor *)0x0)) {
    (this->prev).field_0 = (this->dest).field_0;
    (this->dest).field_0.p = (AActor *)0x0;
  }
  pAVar5 = this->player->mo;
  if (this->t_fight < 0x23) {
    pbVar4 = (byte *)((long)&(pAVar5->super_AActor).flags.Value + 1);
    *pbVar4 = *pbVar4 | 4;
  }
  dVar7 = (pAVar5->super_AActor).__Pos.Y;
  (this->old).X = (pAVar5->super_AActor).__Pos.X;
  (this->old).Y = dVar7;
  return;
}

Assistant:

void DBot::ThinkForMove (ticcmd_t *cmd)
{
	double dist;
	bool stuck;
	int r;

	stuck = false;
	dist = dest ? player->mo->Distance2D(dest) : 0;

	if (missile &&
		(!missile->Vel.X || !missile->Vel.Y || !Check_LOS(missile, SHOOTFOV*3/2)))
	{
		sleft = !sleft;
		missile = NULL; //Probably ended its travel.
	}

#if 0	// this has always been broken and without any reference it cannot be fixed.
	if (player->mo->Angles.Pitch > 0)
		player->mo->Angles.Pitch -= 80;
	else if (player->mo->Angles.Pitch <= -60)
		player->mo->Angles.Pitch += 80;
#endif

	//HOW TO MOVE:
	if (missile && (player->mo->Distance2D(missile)<AVOID_DIST)) //try avoid missile got from P_Mobj.c thinking part.
	{
		Pitch (missile);
		Angle = player->mo->AngleTo(missile);
		cmd->ucmd.sidemove = sleft ? -SIDERUN : SIDERUN;
		cmd->ucmd.forwardmove = -FORWARDRUN; //Back IS best.

		if ((player->mo->Pos() - old).LengthSquared() < THINKDISTSQ
			&& t_strafe<=0)
		{
			t_strafe = 5;
			sleft = !sleft;
		}

		//If able to see enemy while avoiding missile, still fire at enemy.
		if (enemy && Check_LOS (enemy, SHOOTFOV)) 
			Dofire (cmd); //Order bot to fire current weapon
	}
	else if (enemy && P_CheckSight (player->mo, enemy, 0)) //Fight!
	{
		Pitch (enemy);

		//Check if it's more important to get an item than fight.
		if (dest && (dest->flags&MF_SPECIAL)) //Must be an item, that is close enough.
		{
#define is(x) dest->IsKindOf (PClass::FindClass (#x))
			if (
				(
				 (player->mo->health < skill.isp &&
				  (is (Medikit) ||
				   is (Stimpack) ||
				   is (Soulsphere) ||
				   is (Megasphere) ||
				   is (CrystalVial)
				  )
				 ) || (
				  is (Invulnerability) ||
				  is (Invisibility) ||
				  is (Megasphere)
				 ) || 
				 dist < (GETINCOMBAT/4) ||
				 (player->ReadyWeapon == NULL || player->ReadyWeapon->WeaponFlags & WIF_WIMPY_WEAPON)
				)
				&& (dist < GETINCOMBAT || (player->ReadyWeapon == NULL || player->ReadyWeapon->WeaponFlags & WIF_WIMPY_WEAPON))
				&& Reachable (dest))
#undef is
			{
				goto roam; //Pick it up, no matter the situation. All bonuses are nice close up.
			}
		}

		dest = NULL; //To let bot turn right

		if (player->ReadyWeapon != NULL && !(player->ReadyWeapon->WeaponFlags & WIF_WIMPY_WEAPON))
			player->mo->flags &= ~MF_DROPOFF; //Don't jump off any ledges when fighting.

		if (!(enemy->flags3 & MF3_ISMONSTER))
			t_fight = AFTERTICS;

		if (t_strafe <= 0 &&
			((player->mo->Pos() - old).LengthSquared() < THINKDISTSQ
			|| ((pr_botmove()%30)==10))
			)
		{
			stuck = true;
			t_strafe = 5;
			sleft = !sleft;
		}

		Angle = player->mo->AngleTo(enemy);

		if (player->ReadyWeapon == NULL ||
			player->mo->Distance2D(enemy) >
			player->ReadyWeapon->MoveCombatDist)
		{
			// If a monster, use lower speed (just for cooler apperance while strafing down doomed monster)
			cmd->ucmd.forwardmove = (enemy->flags3 & MF3_ISMONSTER) ? FORWARDWALK : FORWARDRUN;
		}
		else if (!stuck) //Too close, so move away.
		{
			// If a monster, use lower speed (just for cooler apperance while strafing down doomed monster)
			cmd->ucmd.forwardmove = (enemy->flags3 & MF3_ISMONSTER) ? -FORWARDWALK : -FORWARDRUN;
		}

		//Strafing.
		if (enemy->flags3 & MF3_ISMONSTER) //It's just a monster so take it down cool.
		{
			cmd->ucmd.sidemove = sleft ? -SIDEWALK : SIDEWALK;
		}
		else
		{
			cmd->ucmd.sidemove = sleft ? -SIDERUN : SIDERUN;
		}
		Dofire (cmd); //Order bot to fire current weapon
	}
	else if (mate && !enemy && (!dest || dest==mate)) //Follow mate move.
	{
		double matedist;

		Pitch (mate);

		if (!Reachable (mate))
		{
			if (mate == dest && pr_botmove.Random() < 32)
			{ // [RH] If the mate is the dest, pick a new dest sometimes
				dest = NULL;
			}
			goto roam;
		}

		Angle = player->mo->AngleTo(mate);

		matedist = player->mo->Distance2D(mate);
		if (matedist > (FRIEND_DIST*2))
			cmd->ucmd.forwardmove = FORWARDRUN;
		else if (matedist > FRIEND_DIST)
			cmd->ucmd.forwardmove = FORWARDWALK; //Walk, when starting to get close.
		else if (matedist < FRIEND_DIST-(FRIEND_DIST/3)) //Got too close, so move away.
			cmd->ucmd.forwardmove = -FORWARDWALK;
	}
	else //Roam after something.
	{
		first_shot = true;

	/////
	roam:
	/////
		if (enemy && Check_LOS (enemy, SHOOTFOV*3/2)) //If able to see enemy while avoiding missile , still fire at it.
			Dofire (cmd); //Order bot to fire current weapon

		if (dest && !(dest->flags&MF_SPECIAL) && dest->health < 0)
		{ //Roaming after something dead.
			dest = NULL;
		}

		if (dest == NULL)
		{
			if (t_fight && enemy) //Enemy/bot has jumped around corner. So what to do?
			{
				if (enemy->player)
				{
					if (((enemy->player->ReadyWeapon != NULL && enemy->player->ReadyWeapon->WeaponFlags & WIF_BOT_EXPLOSIVE) ||
						(pr_botmove()%100)>skill.isp) && player->ReadyWeapon != NULL && !(player->ReadyWeapon->WeaponFlags & WIF_WIMPY_WEAPON))
						dest = enemy;//Dont let enemy kill the bot by supressive fire. So charge enemy.
					else //hide while t_fight, but keep view at enemy.
						Angle = player->mo->AngleTo(enemy);
				} //Just a monster, so kill it.
				else
					dest = enemy;

				//VerifFavoritWeapon(player); //Dont know why here.., but it must be here, i know the reason, but not why at this spot, uh.
			}
			else //Choose a distant target. to get things going.
			{
				r = pr_botmove();
				if (r < 128)
				{
					TThinkerIterator<AInventory> it (MAX_STATNUM+1, bglobal.firstthing);
					AInventory *item = it.Next();

					if (item != NULL || (item = it.Next()) != NULL)
					{
						r &= 63;	// Only scan up to 64 entries at a time
						while (r)
						{
							--r;
							item = it.Next();
						}
						if (item == NULL)
						{
							item = it.Next();
						}
						bglobal.firstthing = item;
						dest = item;
					}
				}
				else if (mate && (r < 179 || P_CheckSight(player->mo, mate)))
				{
					dest = mate;
				}
				else if ((playeringame[(r&(MAXPLAYERS-1))]) && players[(r&(MAXPLAYERS-1))].mo->health > 0)
				{
					dest = players[(r&(MAXPLAYERS-1))].mo; 
				}
			}

			if (dest)
			{
				t_roam = MAXROAM;
			}
		}
		if (dest)
		{ //Bot has a target so roam after it.
			Roam (cmd);
		}

	} //End of movement main part.

	if (!t_roam && dest)
	{
		prev = dest;
		dest = NULL;
	}

	if (t_fight<(AFTERTICS/2))
		player->mo->flags |= MF_DROPOFF;

	old = player->mo->Pos();
}